

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void P_FreeStrifeConversations(void)

{
  FStrifeDialogueNode *pFVar1;
  bool bVar2;
  FStrifeDialogueNode *local_10;
  FStrifeDialogueNode *node;
  
  while (bVar2 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Pop
                           (&StrifeDialogues,&local_10), pFVar1 = local_10, bVar2) {
    if (local_10 != (FStrifeDialogueNode *)0x0) {
      FStrifeDialogueNode::~FStrifeDialogueNode(local_10);
      operator_delete(pFVar1,0x50);
    }
  }
  TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::Clear(&DialogueRoots,1);
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Clear(&ClassRoots,1);
  PrevNode = (FStrifeDialogueNode *)0x0;
  if ((DMenu::CurrentMenu != (DMenu *)0x0) &&
     (bVar2 = DObject::IsKindOf(&DMenu::CurrentMenu->super_DObject,
                                DConversationMenu::RegistrationInfo.MyClass), bVar2)) {
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xd])();
  }
  return;
}

Assistant:

void P_FreeStrifeConversations ()
{
	FStrifeDialogueNode *node;

	while (StrifeDialogues.Pop (node))
	{
		delete node;
	}

	DialogueRoots.Clear();
	ClassRoots.Clear();

	PrevNode = NULL;
	if (DMenu::CurrentMenu != NULL && DMenu::CurrentMenu->IsKindOf(RUNTIME_CLASS(DConversationMenu)))
	{
		DMenu::CurrentMenu->Close();
	}
}